

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_encoder_kernel_2.cpp
# Opt level: O0

void __thiscall
dlib::entropy_encoder_kernel_2::set_stream(entropy_encoder_kernel_2 *this,ostream *out_)

{
  undefined8 uVar1;
  undefined8 in_RSI;
  long in_RDI;
  entropy_encoder_kernel_2 *in_stack_000000a0;
  
  if (*(long *)(in_RDI + 0x10) != 0) {
    flush(in_stack_000000a0);
  }
  *(undefined8 *)(in_RDI + 0x10) = in_RSI;
  uVar1 = std::ios::rdbuf();
  *(undefined8 *)(in_RDI + 0x20) = uVar1;
  *(undefined4 *)(in_RDI + 0x18) = *(undefined4 *)(in_RDI + 8);
  *(undefined4 *)(in_RDI + 0x1c) = *(undefined4 *)(in_RDI + 0xc);
  return;
}

Assistant:

void entropy_encoder_kernel_2::
    set_stream (
        std::ostream& out_
    )
    {
        if (out != 0)
        {
            // if a stream is currently set then flush the buffers to it before
            // we switch to the new stream
            flush();
        }
    
        out = &out_;
        streambuf = out_.rdbuf();

        // reset the encoder state
        low = initial_low;
        high = initial_high;
    }